

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O1

vector<ipv4_address,_std::allocator<ipv4_address>_> *
ipv4_address::resolve
          (vector<ipv4_address,_std::allocator<ipv4_address>_> *__return_storage_ptr__,
          string *hostname)

{
  iterator __position;
  int __ecode;
  ostream *poVar1;
  char *pcVar2;
  runtime_error *this;
  addrinfo *paVar3;
  addrinfo *list_head;
  addrinfo hints;
  stringstream ss;
  addrinfo *local_200;
  string local_1f8 [32];
  addrinfo local_1d8;
  ipv4_address local_1a8 [4];
  ostream local_198 [376];
  
  local_1d8.ai_flags = 0;
  local_1d8.ai_protocol = 0;
  local_1d8.ai_canonname = (char *)0x0;
  local_1d8.ai_next = (addrinfo *)0x0;
  local_1d8.ai_addrlen = 0;
  local_1d8._20_4_ = 0;
  local_1d8.ai_addr = (sockaddr *)0x0;
  local_1d8.ai_family = 2;
  local_1d8.ai_socktype = 1;
  __ecode = getaddrinfo((hostname->_M_dataplus)._M_p,(char *)0x0,&local_1d8,&local_200);
  if (__ecode != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"can not resolve server \'",0x18);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,(hostname->_M_dataplus)._M_p,hostname->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\': ",3);
    pcVar2 = gai_strerror(__ecode);
    std::operator<<(poVar1,pcVar2);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this,local_1f8);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->super__Vector_base<ipv4_address,_std::allocator<ipv4_address>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ipv4_address,_std::allocator<ipv4_address>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ipv4_address,_std::allocator<ipv4_address>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_200 != (addrinfo *)0x0) {
    paVar3 = local_200;
    do {
      if (paVar3->ai_family != 2) {
        __assert_fail("i->ai_family == AF_INET",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/address.cpp"
                      ,0x42,
                      "static std::vector<ipv4_address> ipv4_address::resolve(const std::string &)")
        ;
      }
      if (paVar3->ai_socktype != 1) {
        __assert_fail("i->ai_socktype == SOCK_STREAM",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/address.cpp"
                      ,0x43,
                      "static std::vector<ipv4_address> ipv4_address::resolve(const std::string &)")
        ;
      }
      local_1a8[0].addr_net = *(uint32_t *)(paVar3->ai_addr->sa_data + 2);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<ipv4_address,_std::allocator<ipv4_address>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<ipv4_address,_std::allocator<ipv4_address>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ipv4_address,_std::allocator<ipv4_address>_>::_M_realloc_insert<ipv4_address>
                  (__return_storage_ptr__,__position,local_1a8);
      }
      else {
        (__position._M_current)->addr_net = local_1a8[0].addr_net;
        (__return_storage_ptr__->super__Vector_base<ipv4_address,_std::allocator<ipv4_address>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      paVar3 = paVar3->ai_next;
    } while (paVar3 != (addrinfo *)0x0);
  }
  freeaddrinfo(local_200);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ipv4_address> ipv4_address::resolve(std::string const& hostname)
{
    addrinfo hints{};
    hints.ai_family = AF_INET;
    hints.ai_socktype = SOCK_STREAM;

    addrinfo* list_head;
    int res = getaddrinfo(hostname.c_str(), nullptr, &hints, &list_head);
    if (res != 0)
    {
        std::stringstream ss;
        ss << "can not resolve server '" << hostname << "': " << gai_strerror(res);
        throw std::runtime_error(ss.str());
    }

    std::vector<ipv4_address> r;

    for (addrinfo* i = list_head; i != nullptr; i = i->ai_next)
    {
        assert(i->ai_family == AF_INET);
        assert(i->ai_socktype == SOCK_STREAM);
        r.push_back(ipv4_address{reinterpret_cast<sockaddr_in const*>(i->ai_addr)->sin_addr.s_addr});
    }

    // TODO: move to destructor
    freeaddrinfo(list_head);

    return r;
}